

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSharedPPData.cpp
# Opt level: O0

void __thiscall
SharedPPDataTest_testPODProperty_Test::SharedPPDataTest_testPODProperty_Test
          (SharedPPDataTest_testPODProperty_Test *this)

{
  SharedPPDataTest_testPODProperty_Test *this_local;
  
  SharedPPDataTest::SharedPPDataTest(&this->super_SharedPPDataTest);
  (this->super_SharedPPDataTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SharedPPDataTest_testPODProperty_Test_01036128;
  return;
}

Assistant:

TEST_F(SharedPPDataTest, testPODProperty)
{
    int i = 5;
    shared->AddProperty("test",i);
	int o = 0;
    EXPECT_TRUE(shared->GetProperty("test",o));
    EXPECT_EQ(5, o);
    EXPECT_FALSE(shared->GetProperty("test2",o));
    EXPECT_EQ(5, o);

    float f = 12.f, m;
    shared->AddProperty("test",f);
    EXPECT_TRUE(shared->GetProperty("test",m));
    EXPECT_EQ(12.f, m);
}